

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Field * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::FindAndVerifyField
          (ProtoStreamObjectSource *this,Type *type,uint32 tag)

{
  Field *pFVar1;
  Field *pFVar2;
  Field *pFVar3;
  
  pFVar1 = anon_unknown_4::FindFieldByNumber(type,tag >> 3);
  if (pFVar1 == (Field *)0x0) {
    pFVar1 = (Field *)0x0;
  }
  else if ((tag & 7) !=
           *(uint *)(protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                    (ulong)(uint)pFVar1->kind_ * 4)) {
    pFVar3 = (Field *)0x0;
    pFVar2 = pFVar1;
    if (pFVar1->cardinality_ != 3) {
      pFVar2 = pFVar3;
    }
    if (0xfffffffb < pFVar1->kind_ - 0xdU) {
      pFVar2 = pFVar3;
    }
    pFVar1 = pFVar2;
    if ((tag & 7) != 2) {
      pFVar1 = pFVar3;
    }
  }
  return pFVar1;
}

Assistant:

const google::protobuf::Field* ProtoStreamObjectSource::FindAndVerifyField(
    const google::protobuf::Type& type, uint32 tag) const {
  // Lookup the new field in the type by tag number.
  const google::protobuf::Field* field = FindFieldByNumber(type, tag >> 3);
  // Verify if the field corresponds to the wire type in tag.
  // If there is any discrepancy, mark the field as not found.
  if (field != nullptr) {
    WireFormatLite::WireType expected_type =
        WireFormatLite::WireTypeForFieldType(
            static_cast<WireFormatLite::FieldType>(field->kind()));
    WireFormatLite::WireType actual_type = WireFormatLite::GetTagWireType(tag);
    if (actual_type != expected_type &&
        (!IsPackable(*field) ||
         actual_type != WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
      field = nullptr;
    }
  }
  return field;
}